

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regress.cpp
# Opt level: O1

void __thiscall regress_github_5_Test::~regress_github_5_Test(regress_github_5_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(regress, github_5)
{
    static const char latin1_data[] = "F\xfcr Elise";
    static const char utf8_data[] = "F\xc3\xbcr Elise";
    ST::string s;
    ST::char_buffer init(latin1_data, strlen(latin1_data));
    try {
        // This should throw
        s = std::move(init);
        ASSERT_FALSE(true);
    } catch (ST::unicode_error &) {
        s = ST::string::from_latin_1(init);
    }

    EXPECT_STREQ(utf8_data, s.c_str());
}